

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O0

bool __thiscall OpenMD::NPrT::etaConverged(NPrT *this)

{
  double *pdVar1;
  long in_RDI;
  __type_conflict _Var2;
  double dVar3;
  RealType sumEta;
  RealType diffEta;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined8 local_20;
  undefined4 local_c;
  
  local_20 = 0.0;
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x298),local_c,local_c);
    dVar3 = *pdVar1;
    RectMatrix<double,_3U,_3U>::operator()
              ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_c);
    _Var2 = std::pow<double,int>(dVar3,in_stack_ffffffffffffffcc);
    local_20 = _Var2 + local_20;
  }
  dVar3 = sqrt(local_20 / 3.0);
  return dVar3 <= *(double *)(in_RDI + 0x198);
}

Assistant:

bool NPrT::etaConverged() {
    int i;
    RealType diffEta, sumEta;

    sumEta = 0;
    for (i = 0; i < 3; i++) {
      sumEta += pow(prevEta_(i, i) - eta(i, i), 2);
    }

    diffEta = sqrt(sumEta / 3.0);

    return (diffEta <= etaTolerance);
  }